

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# networkincludes.cpp
# Opt level: O3

void __thiscall network_pimpl::insert_event(network_pimpl *this,EventDataType *value)

{
  EventDataType *pEVar1;
  _Alloc_hider _Var2;
  int iVar3;
  ostream *poVar4;
  EventDataType *this_00;
  bool bVar5;
  string local_b8;
  string local_98;
  string local_78;
  network_pimpl *local_58;
  string local_50;
  
  this_00 = (this->events).super__Vector_base<EventDataType,_std::allocator<EventDataType>_>._M_impl
            .super__Vector_impl_data._M_start;
  pEVar1 = (this->events).super__Vector_base<EventDataType,_std::allocator<EventDataType>_>._M_impl.
           super__Vector_impl_data._M_finish;
  local_58 = this;
  if (this_00 != pEVar1) {
    do {
      EventDataType::getName_abi_cxx11_(&local_b8,this_00);
      EventDataType::getName_abi_cxx11_(&local_78,value);
      if ((local_b8._M_string_length == local_78._M_string_length) &&
         ((local_b8._M_string_length == 0 ||
          (iVar3 = bcmp(local_b8._M_dataplus._M_p,local_78._M_dataplus._M_p,
                        local_b8._M_string_length), iVar3 == 0)))) {
        EventDataType::getOrigin_abi_cxx11_(&local_98,this_00);
        EventDataType::getOrigin_abi_cxx11_(&local_50,value);
        _Var2._M_p = local_50._M_dataplus._M_p;
        if (local_98._M_string_length == local_50._M_string_length) {
          if (local_98._M_string_length == 0) {
            bVar5 = true;
          }
          else {
            iVar3 = bcmp(local_98._M_dataplus._M_p,local_50._M_dataplus._M_p,
                         local_98._M_string_length);
            bVar5 = iVar3 == 0;
          }
        }
        else {
          bVar5 = false;
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)_Var2._M_p != &local_50.field_2) {
          operator_delete(_Var2._M_p,local_50.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_98._M_dataplus._M_p != &local_98.field_2) {
          operator_delete(local_98._M_dataplus._M_p,local_98.field_2._M_allocated_capacity + 1);
        }
      }
      else {
        bVar5 = false;
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_78._M_dataplus._M_p != &local_78.field_2) {
        operator_delete(local_78._M_dataplus._M_p,local_78.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_b8._M_dataplus._M_p != &local_b8.field_2) {
        operator_delete(local_b8._M_dataplus._M_p,local_b8.field_2._M_allocated_capacity + 1);
      }
      if (bVar5) {
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cerr,"---duplicate event ",0x13);
        EventDataType::getName_abi_cxx11_(&local_b8,this_00);
        poVar4 = std::__ostream_insert<char,std::char_traits<char>>
                           ((ostream *)&std::cerr,local_b8._M_dataplus._M_p,
                            local_b8._M_string_length);
        std::__ostream_insert<char,std::char_traits<char>>(poVar4,"\n",1);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_b8._M_dataplus._M_p == &local_b8.field_2) {
          return;
        }
        operator_delete(local_b8._M_dataplus._M_p,local_b8.field_2._M_allocated_capacity + 1);
        return;
      }
      this_00 = this_00 + 1;
    } while (this_00 != pEVar1);
  }
  std::vector<EventDataType,_std::allocator<EventDataType>_>::push_back(&local_58->events,value);
  return;
}

Assistant:

void network_pimpl::insert_event(const EventDataType &value){
    for(auto const& ev : events){
        if(ev.getName() == value.getName() && ev.getOrigin() == value.getOrigin()){
            std::cerr << "---duplicate event " << ev.getName() << "\n";
            return;
        }
    }
    events.push_back(value);
}